

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

IceTBoolean strategy_uses_single_image_strategy(IceTEnum strategy)

{
  IceTBoolean local_9;
  IceTEnum strategy_local;
  
  switch(strategy) {
  case 0x6001:
    local_9 = '\0';
    break;
  case 0x6002:
    local_9 = '\x01';
    break;
  case 0x6003:
    local_9 = '\0';
    break;
  case 0x6004:
    local_9 = '\x01';
    break;
  case 0x6005:
    local_9 = '\0';
    break;
  default:
    printf("ERROR: unknown strategy type.");
    local_9 = '\x01';
  }
  return local_9;
}

Assistant:

IceTBoolean strategy_uses_single_image_strategy(IceTEnum strategy)
{
    switch (strategy) {
      case ICET_STRATEGY_DIRECT:        return ICET_FALSE;
      case ICET_STRATEGY_SEQUENTIAL:    return ICET_TRUE;
      case ICET_STRATEGY_SPLIT:         return ICET_FALSE;
      case ICET_STRATEGY_REDUCE:        return ICET_TRUE;
      case ICET_STRATEGY_VTREE:         return ICET_FALSE;
      default:
          printf("ERROR: unknown strategy type.");
          return ICET_TRUE;
    }
}